

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

FFSVarRec_conflict CreateVarRec(SstStream Stream,char *ArrayName)

{
  int iVar1;
  int *piVar2;
  void *pvVar3;
  FFSVarRec_conflict pFVar4;
  char *pcVar5;
  size_t *psVar6;
  size_t **ppsVar7;
  void **ppvVar8;
  char *in_RSI;
  long in_RDI;
  FFSVarRec_conflict Ret;
  FFSReaderMarshalBase *Info;
  
  piVar2 = *(int **)(in_RDI + 0x300);
  pvVar3 = realloc(*(void **)(piVar2 + 2),(long)(*piVar2 + 1) << 3);
  *(void **)(piVar2 + 2) = pvVar3;
  pFVar4 = (FFSVarRec_conflict)calloc(1,0x60);
  pcVar5 = strdup(in_RSI);
  pFVar4->VarName = pcVar5;
  psVar6 = (size_t *)calloc(8,(long)*(int *)(in_RDI + 0x238));
  pFVar4->PerWriterMetaFieldOffset = psVar6;
  ppsVar7 = (size_t **)calloc(8,(long)*(int *)(in_RDI + 0x238));
  pFVar4->PerWriterStart = ppsVar7;
  psVar6 = (size_t *)calloc(8,(long)*(int *)(in_RDI + 0x238));
  pFVar4->PerWriterBlockStart = psVar6;
  psVar6 = (size_t *)calloc(8,(long)*(int *)(in_RDI + 0x238));
  pFVar4->PerWriterBlockCount = psVar6;
  ppsVar7 = (size_t **)calloc(8,(long)*(int *)(in_RDI + 0x238));
  pFVar4->PerWriterCounts = ppsVar7;
  ppvVar8 = (void **)calloc(8,(long)*(int *)(in_RDI + 0x238));
  pFVar4->PerWriterIncomingData = ppvVar8;
  psVar6 = (size_t *)calloc(8,(long)*(int *)(in_RDI + 0x238));
  pFVar4->PerWriterIncomingSize = psVar6;
  iVar1 = *piVar2;
  *piVar2 = iVar1 + 1;
  *(FFSVarRec_conflict *)(*(long *)(piVar2 + 2) + (long)iVar1 * 8) = pFVar4;
  return pFVar4;
}

Assistant:

static FFSVarRec CreateVarRec(SstStream Stream, const char *ArrayName)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    Info->VarList = realloc(Info->VarList, sizeof(Info->VarList[0]) * (Info->VarCount + 1));
    FFSVarRec Ret = calloc(1, sizeof(struct FFSVarRec));
    Ret->VarName = strdup(ArrayName);
    Ret->PerWriterMetaFieldOffset = calloc(sizeof(size_t), Stream->WriterCohortSize);
    Ret->PerWriterStart = calloc(sizeof(size_t *), Stream->WriterCohortSize);
    Ret->PerWriterBlockStart = calloc(sizeof(size_t *), Stream->WriterCohortSize);
    Ret->PerWriterBlockCount = calloc(sizeof(size_t *), Stream->WriterCohortSize);
    Ret->PerWriterCounts = calloc(sizeof(size_t *), Stream->WriterCohortSize);
    Ret->PerWriterIncomingData = calloc(sizeof(void *), Stream->WriterCohortSize);
    Ret->PerWriterIncomingSize = calloc(sizeof(size_t), Stream->WriterCohortSize);
    Info->VarList[Info->VarCount++] = Ret;
    return Ret;
}